

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall
OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_
          (OSTEI_VRR_Algorithm_Base *this,QAMList *order,QAM *am)

{
  pointer pcVar1;
  pointer pQVar2;
  bool bVar3;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> _Var4;
  const_iterator cVar5;
  undefined1 auVar6 [8];
  QAMList req;
  char *local_f0;
  size_type local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  QAM *local_d0;
  undefined1 local_c8 [8];
  pointer pQStack_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [24];
  
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<QAM*,std::vector<QAM,std::allocator<QAM>>>,__gnu_cxx::__ops::_Iter_equals_val<QAM_const>>
                    ((order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var4._M_current ==
      (order->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    cVar5 = std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::find
                      (&(this->allam_)._M_t,am);
    if ((_Rb_tree_header *)cVar5._M_node != &(this->allam_)._M_t._M_impl.super__Rb_tree_header) {
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      local_c8 = (undefined1  [8])0x0;
      pQStack_c0 = (pointer)0x0;
      if (local_f0 == local_e0) {
        local_a8[8] = (undefined1)uStack_d8;
        local_a8[9] = uStack_d8._1_1_;
        local_a8[10] = uStack_d8._2_1_;
        local_a8[0xb] = uStack_d8._3_1_;
        local_a8[0xc] = uStack_d8._4_1_;
        local_a8[0xd] = uStack_d8._5_1_;
        local_a8[0xe] = uStack_d8._6_1_;
        local_a8[0xf] = uStack_d8._7_1_;
        local_b8._M_p = local_a8;
      }
      else {
        local_b8._M_p = local_f0;
      }
      local_b0 = local_e8;
      local_e8 = 0;
      local_e0[0] = '\0';
      local_f0 = local_e0;
      bVar3 = QAM::operator==(am,(QAM *)local_c8);
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      if (!bVar3) {
        local_68._0_4_ = (am->qam)._M_elems[0];
        local_68._4_4_ = (am->qam)._M_elems[1];
        local_68._8_4_ = (am->qam)._M_elems[2];
        local_68._12_4_ = (am->qam)._M_elems[3];
        pcVar1 = (am->tag)._M_dataplus._M_p;
        local_58._M_p = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar1,pcVar1 + (am->tag)._M_string_length);
        GetAMReq((QAMList *)local_c8,this,(QAM *)local_68);
        local_d0 = am;
        if (local_58._M_p != local_48) {
          operator_delete(local_58._M_p);
        }
        pQVar2 = pQStack_c0;
        if (local_c8 != (undefined1  [8])pQStack_c0) {
          auVar6 = local_c8;
          do {
            local_98._0_4_ = (((pointer)auVar6)->qam)._M_elems[0];
            local_98._4_4_ = (((pointer)auVar6)->qam)._M_elems[1];
            local_98._8_4_ = (((pointer)auVar6)->qam)._M_elems[2];
            local_98._12_4_ = (((pointer)auVar6)->qam)._M_elems[3];
            pcVar1 = (((pointer)auVar6)->tag)._M_dataplus._M_p;
            local_88._M_p = local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar1,pcVar1 + (((pointer)auVar6)->tag)._M_string_length
                      );
            AMOrder_AddWithDependencies_(this,order,(QAM *)local_98);
            if (local_88._M_p != local_78) {
              operator_delete(local_88._M_p);
            }
            auVar6 = (undefined1  [8])((long)auVar6 + 0x30);
          } while (auVar6 != (undefined1  [8])pQVar2);
        }
        std::vector<QAM,_std::allocator<QAM>_>::push_back(order,local_d0);
        std::vector<QAM,_std::allocator<QAM>_>::~vector
                  ((vector<QAM,_std::allocator<QAM>_> *)local_c8);
      }
    }
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::AMOrder_AddWithDependencies_(QAMList & order, QAM am) const
{
    // skip if it was already done somewhere
    if(std::find(order.begin(), order.end(), am) != order.end())
        return;

    // skip if it's not done by VRR
    if(allam_.count(am) == 0 || am == QAM{0,0,0,0})
        return;

    // get requirements
    auto req = GetAMReq(am);

    for(const auto & it : req)
        AMOrder_AddWithDependencies_(order, it);

    order.push_back(am);
}